

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_basics.cpp
# Opt level: O0

Am_Object copy_command_tree(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Wrapper *pAVar2;
  Am_Object *in_RSI;
  Am_Object local_60;
  undefined1 local_58 [8];
  Am_Value value;
  Am_Object child_copy;
  Am_Object parent;
  Am_Object child;
  Am_Object local_20 [2];
  Am_Object *command_obj_local;
  
  command_obj_local = command_obj;
  Am_Object::Copy_Value_Only(local_20,(char *)in_RSI);
  Am_Object::operator=(in_RSI,local_20);
  Am_Object::~Am_Object(local_20);
  Am_Object::Am_Object(&parent);
  Am_Object::Am_Object(&child_copy);
  Am_Object::Am_Object((Am_Object *)&value.value);
  Am_Object::operator=(&child_copy,in_RSI);
  Am_Value::Am_Value((Am_Value *)local_58);
  while( true ) {
    in_value = Am_Object::Peek(&child_copy,0x167,0);
    Am_Value::operator=((Am_Value *)local_58,in_value);
    bVar1 = Am_Value::Valid((Am_Value *)local_58);
    if ((!bVar1) || (local_58._0_2_ != 0xa001)) break;
    Am_Object::operator=(&parent,(Am_Value *)local_58);
    Am_Object::Copy_Value_Only(&local_60,(char *)&parent);
    Am_Object::operator=((Am_Object *)&value.value,&local_60);
    Am_Object::~Am_Object(&local_60);
    pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&value.value);
    Am_Object::Set(&child_copy,0x167,pAVar2,0);
    pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&child_copy);
    Am_Object::Set((Am_Object *)&value.value,0x154,pAVar2,0);
    Am_Object::operator=(&child_copy,(Am_Object *)&value.value);
  }
  Am_Object::Am_Object(command_obj,in_RSI);
  Am_Value::~Am_Value((Am_Value *)local_58);
  Am_Object::~Am_Object((Am_Object *)&value.value);
  Am_Object::~Am_Object(&child_copy);
  Am_Object::~Am_Object(&parent);
  return (Am_Object)(Am_Object_Data *)command_obj;
}

Assistant:

Am_Object
copy_command_tree(Am_Object command_obj)
{
  command_obj = command_obj.Copy_Value_Only();
  Am_Object child, parent, child_copy;
  parent = command_obj;
  Am_Value value;
  while (true) {
    value = parent.Peek(Am_IMPLEMENTATION_CHILD);
    if (value.Valid() && value.type == Am_OBJECT) {
      child = value;
      child_copy = child.Copy_Value_Only();
      parent.Set(Am_IMPLEMENTATION_CHILD, child_copy);
      child_copy.Set(Am_IMPLEMENTATION_PARENT, parent);
      parent = child_copy;
    } else
      break; //leave loop
  }
  return command_obj;
}